

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t tar_read_header(archive_read *a,tar *tar,archive_entry *entry,size_t *unconsumed)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  wchar_t wVar4;
  int iVar5;
  char *pcVar6;
  ssize_t sVar7;
  wchar_t local_84;
  wchar_t local_80;
  wchar_t local_7c;
  ssize_t bytes_read;
  int32_t seen_headers;
  archive_entry_header_gnutar *gnuheader;
  archive_entry_header_ustar *header;
  char *h;
  wchar_t local_40;
  wchar_t eof_fatal;
  wchar_t err2;
  wchar_t err;
  ssize_t bytes;
  size_t *unconsumed_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  eof_fatal = L'\0';
  bVar1 = false;
  bytes_read._4_4_ = 0;
  bVar3 = false;
  bVar2 = false;
  tar->pax_hdrcharset_utf8 = 1;
  tar->sparse_gnu_attributes_seen = '\0';
  (tar->entry_gname).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  (tar->entry_linkpath).length = 0;
  bytes = (ssize_t)unconsumed;
  unconsumed_local = (size_t *)entry;
  entry_local = (archive_entry *)tar;
  tar_local = (tar *)a;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format = 0x30000;
    (a->archive).archive_format_name = "tar";
  }
  while( true ) {
    tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes);
    pcVar6 = (char *)__archive_read_ahead((archive_read *)tar_local,0x200,(ssize_t *)&err2);
    if (_err2 == 0) {
      if (bVar1) {
        archive_set_error((archive *)tar_local,0x16,
                          "Damaged tar archive (end-of-archive within a sequence of headers)");
        return L'\xffffffe2';
      }
      return L'\x01';
    }
    if (pcVar6 == (char *)0x0) break;
    *(long *)bytes = *(long *)bytes + 0x200;
    if ((*pcVar6 == '\0') && (wVar4 = archive_block_is_null(pcVar6), wVar4 != L'\0')) {
      if (*(int *)((long)&(entry_local->ae_gname).aes_mbs.buffer_length + 4) == 0) {
        tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes);
        pcVar6 = (char *)__archive_read_ahead((archive_read *)tar_local,0x200,(ssize_t *)0x0);
        if (((pcVar6 != (char *)0x0) && (*pcVar6 == '\0')) &&
           (wVar4 = archive_block_is_null(pcVar6), wVar4 != L'\0')) {
          __archive_read_consume((archive_read *)tar_local,0x200);
        }
        archive_clear_error((archive *)tar_local);
        return L'\x01';
      }
    }
    else {
      wVar4 = checksum((archive_read *)tar_local,pcVar6);
      if (wVar4 == L'\0') {
        tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes);
        archive_set_error((archive *)tar_local,0x16,"Damaged tar archive (bad header checksum)");
        if (bVar1) {
          return L'\xffffffe2';
        }
        return L'\xfffffff6';
      }
      switch(pcVar6[0x9c]) {
      case 'A':
        if ((bytes_read._4_4_ & 1) != 0) {
          return L'\xffffffe2';
        }
        bytes_read._4_4_ = bytes_read._4_4_ | 1;
        *(undefined4 *)&(tar_local->entry_pathname).buffer_length = 0x30002;
        (tar_local->entry_pathname_override).s = "Solaris tar";
        local_40 = header_Solaris_ACL((archive_read *)tar_local,(tar *)entry_local,
                                      (archive_entry *)unconsumed_local,pcVar6,(size_t *)bytes);
        break;
      default:
        if (*(long *)(pcVar6 + 0x101) == 0x20207261747375) {
          *(undefined4 *)&(tar_local->entry_pathname).buffer_length = 0x30004;
          (tar_local->entry_pathname_override).s = "GNU tar format";
          local_40 = header_gnutar((archive_read *)tar_local,(tar *)entry_local,
                                   (archive_entry *)unconsumed_local,pcVar6,(size_t *)bytes);
        }
        else {
          iVar5 = memcmp(pcVar6 + 0x101,"ustar",5);
          if (iVar5 == 0) {
            if ((int)(tar_local->entry_pathname).buffer_length != 0x30002) {
              *(undefined4 *)&(tar_local->entry_pathname).buffer_length = 0x30001;
              (tar_local->entry_pathname_override).s = "POSIX ustar format";
            }
            local_40 = header_ustar((archive_read *)tar_local,(tar *)entry_local,
                                    (archive_entry *)unconsumed_local,pcVar6);
          }
          else {
            *(undefined4 *)&(tar_local->entry_pathname).buffer_length = 0x30000;
            (tar_local->entry_pathname_override).s = "tar (non-POSIX)";
            local_40 = header_old_tar((archive_read *)tar_local,(tar *)entry_local,
                                      (archive_entry *)unconsumed_local,pcVar6);
          }
        }
        if (eof_fatal < local_40) {
          local_7c = eof_fatal;
        }
        else {
          local_7c = local_40;
        }
        if (local_7c < L'\xffffffec') {
          return L'\xffffffe2';
        }
        if ((((int)(entry_local->ae_gname).aes_mbs.buffer_length == 0) ||
            ((bytes_read._4_4_ & 0x200) != 0)) ||
           (wVar4 = is_mac_metadata_entry((archive_entry *)unconsumed_local), wVar4 == L'\0')) {
          if ((char)(entry_local->ae_fflags_text).aes_wcs.buffer_length != '\0') {
            if ((*(char *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 1) != 'S')
               && (*(char *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 1) != '0')
               ) {
              archive_set_error((archive *)tar_local,-1,"Non-regular file cannot be sparse");
              return L'\xffffffec';
            }
            if ((((int)(entry_local->ae_fflags_text).aes_wcs.length != 0) ||
                (*(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.length + 4) != 0)) &&
               (((int)(entry_local->ae_fflags_text).aes_wcs.length != 0 ||
                (*(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.length + 4) != 1)))) {
              if (((int)(entry_local->ae_fflags_text).aes_wcs.length != 1) ||
                 (*(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.length + 4) != 0)) {
                archive_set_error((archive *)tar_local,-1,"Unrecognized GNU sparse file format");
                return L'\xffffffec';
              }
              sVar7 = gnu_sparse_10_read((archive_read *)tar_local,(tar *)entry_local,
                                         (size_t *)bytes);
              if (sVar7 < 0) {
                return (wchar_t)sVar7;
              }
              (entry_local->ae_stat).aest_devminor = (entry_local->ae_stat).aest_devminor - sVar7;
            }
          }
          return local_7c;
        }
        local_40 = read_mac_metadata_blob
                             ((archive_read *)tar_local,(archive_entry *)unconsumed_local,
                              (size_t *)bytes);
        if (local_40 < L'\xffffffec') {
          return L'\xffffffe2';
        }
        local_80 = local_40;
        if (local_7c < local_40) {
          local_80 = local_7c;
        }
        eof_fatal = local_80;
        bytes_read._4_4_ = 0x200;
        bVar3 = false;
        bVar2 = false;
        break;
      case 'K':
        if ((bytes_read._4_4_ & 4) != 0) {
          return L'\xffffffe2';
        }
        bytes_read._4_4_ = bytes_read._4_4_ | 4;
        local_40 = header_gnu_longlink((archive_read *)tar_local,(tar *)entry_local,
                                       (archive_entry *)unconsumed_local,pcVar6,(size_t *)bytes);
        break;
      case 'L':
        if ((bytes_read._4_4_ & 8) != 0) {
          return L'\xffffffe2';
        }
        bytes_read._4_4_ = bytes_read._4_4_ | 8;
        local_40 = header_gnu_longname((archive_read *)tar_local,(tar *)entry_local,
                                       (archive_entry *)unconsumed_local,pcVar6,(size_t *)bytes);
        break;
      case 'V':
        if (bVar3) {
          return L'\xffffffe2';
        }
        bVar3 = true;
        local_40 = header_volume((archive_read *)tar_local,(tar *)entry_local,
                                 (archive_entry *)unconsumed_local,pcVar6,(size_t *)bytes);
        break;
      case 'X':
        if ((bytes_read._4_4_ & 0x20) != 0) {
          return L'\xffffffe2';
        }
        bytes_read._4_4_ = bytes_read._4_4_ | 0x20;
        *(undefined4 *)&(tar_local->entry_pathname).buffer_length = 0x30002;
        (tar_local->entry_pathname_override).s = "POSIX pax interchange format (Sun variant)";
        local_40 = header_pax_extension
                             ((archive_read *)tar_local,(tar *)entry_local,
                              (archive_entry *)unconsumed_local,pcVar6,(size_t *)bytes);
        break;
      case 'g':
        if (bVar2) {
          return L'\xffffffe2';
        }
        bVar2 = true;
        *(undefined4 *)&(tar_local->entry_pathname).buffer_length = 0x30002;
        (tar_local->entry_pathname_override).s = "POSIX pax interchange format";
        local_40 = header_pax_global((archive_read *)tar_local,(tar *)entry_local,
                                     (archive_entry *)unconsumed_local,pcVar6,(size_t *)bytes);
        break;
      case 'x':
        if ((bytes_read._4_4_ & 0x20) != 0) {
          return L'\xffffffe2';
        }
        bytes_read._4_4_ = bytes_read._4_4_ | 0x20;
        *(undefined4 *)&(tar_local->entry_pathname).buffer_length = 0x30002;
        (tar_local->entry_pathname_override).s = "POSIX pax interchange format";
        local_40 = header_pax_extension
                             ((archive_read *)tar_local,(tar *)entry_local,
                              (archive_entry *)unconsumed_local,pcVar6,(size_t *)bytes);
      }
      if (eof_fatal < local_40) {
        local_84 = eof_fatal;
      }
      else {
        local_84 = local_40;
      }
      eof_fatal = local_84;
      if (local_84 == L'\xffffffe2') {
        return L'\xffffffe2';
      }
      if (bytes_read._4_4_ != 0) {
        bVar1 = true;
      }
    }
  }
  archive_set_error((archive *)tar_local,0x54,
                    "Truncated tar archive detected while reading next header");
  return L'\xffffffe2';
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err = ARCHIVE_OK, err2;
	int eof_fatal = 0; /* EOF is okay at some points... */
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Bitmask of what header types we've seen. */
	int32_t seen_headers = 0;
	static const int32_t seen_A_header = 1;
	static const int32_t seen_g_header = 2;
	static const int32_t seen_K_header = 4;
	static const int32_t seen_L_header = 8;
	static const int32_t seen_V_header = 16;
	static const int32_t seen_x_header = 32; /* Also X */
	static const int32_t seen_mac_metadata = 512;

	tar->pax_hdrcharset_utf8 = 1;
	tar->sparse_gnu_attributes_seen = 0;
	archive_string_empty(&(tar->entry_gname));
	archive_string_empty(&(tar->entry_pathname));
	archive_string_empty(&(tar->entry_pathname_override));
	archive_string_empty(&(tar->entry_uname));
	archive_string_empty(&tar->entry_linkpath);

	/* Ensure format is set. */
	if (a->archive.archive_format_name == NULL) {
		a->archive.archive_format = ARCHIVE_FORMAT_TAR;
		a->archive.archive_format_name = "tar";
	}

	/*
	 * TODO: Write global/default pax options into
	 * 'entry' struct here before overwriting with
	 * file-specific options.
	 */

	/* Loop over all the headers needed for the next entry */
	for (;;) {

		/* Find the next valid header record. */
		while (1) {
			tar_flush_unconsumed(a, unconsumed);

			/* Read 512-byte header record */
			h = __archive_read_ahead(a, 512, &bytes);
			if (bytes == 0) { /* EOF at a block boundary. */
				if (eof_fatal) {
					/* We've read a special header already;
					 * if there's no regular header, then this is
					 * a premature EOF. */
					archive_set_error(&a->archive, EINVAL,
							  "Damaged tar archive (end-of-archive within a sequence of headers)");
					return (ARCHIVE_FATAL);
				} else {
					return (ARCHIVE_EOF);
				}
			}
			if (h == NULL) {  /* Short block at EOF; this is bad. */
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated tar archive"
				    " detected while reading next header");
				return (ARCHIVE_FATAL);
			}
			*unconsumed += 512;

			if (h[0] == 0 && archive_block_is_null(h)) {
				/* We found a NULL block which indicates end-of-archive */

				if (tar->read_concatenated_archives) {
					/* We're ignoring NULL blocks, so keep going. */
					continue;
				}

				/* Try to consume a second all-null record, as well. */
				/* If we can't, that's okay. */
				tar_flush_unconsumed(a, unconsumed);
				h = __archive_read_ahead(a, 512, NULL);
				if (h != NULL && h[0] == 0 && archive_block_is_null(h))
						__archive_read_consume(a, 512);

				archive_clear_error(&a->archive);
				return (ARCHIVE_EOF);
			}

			/* This is NOT a null block, so it must be a valid header. */
			if (!checksum(a, h)) {
				tar_flush_unconsumed(a, unconsumed);
				archive_set_error(&a->archive, EINVAL,
						  "Damaged tar archive (bad header checksum)");
				/* If we've read some critical information (pax headers, etc)
				 * and _then_ see a bad header, we can't really recover. */
				if (eof_fatal) {
					return (ARCHIVE_FATAL);
				} else {
					return (ARCHIVE_RETRY);
				}
			}
			break;
		}

		/* Determine the format variant. */
		header = (const struct archive_entry_header_ustar *)h;
		switch(header->typeflag[0]) {
		case 'A': /* Solaris tar ACL */
			if (seen_headers & seen_A_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_A_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "Solaris tar";
			err2 = header_Solaris_ACL(a, tar, entry, h, unconsumed);
			break;
		case 'g': /* POSIX-standard 'g' header. */
			if (seen_headers & seen_g_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_g_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "POSIX pax interchange format";
			err2 = header_pax_global(a, tar, entry, h, unconsumed);
			break;
		case 'K': /* Long link name (GNU tar, others) */
			if (seen_headers & seen_K_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_K_header;
			err2 = header_gnu_longlink(a, tar, entry, h, unconsumed);
			break;
		case 'L': /* Long filename (GNU tar, others) */
			if (seen_headers & seen_L_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_L_header;
			err2 = header_gnu_longname(a, tar, entry, h, unconsumed);
			break;
		case 'V': /* GNU volume header */
			if (seen_headers & seen_V_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_V_header;
			err2 = header_volume(a, tar, entry, h, unconsumed);
			break;
		case 'X': /* Used by SUN tar; same as 'x'. */
			if (seen_headers & seen_x_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_x_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name =
				"POSIX pax interchange format (Sun variant)";
			err2 = header_pax_extension(a, tar, entry, h, unconsumed);
			break;
		case 'x': /* POSIX-standard 'x' header. */
			if (seen_headers & seen_x_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_x_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "POSIX pax interchange format";
			err2 = header_pax_extension(a, tar, entry, h, unconsumed);
			break;
		default: /* Regular header: Legacy tar, GNU tar, or ustar */
			gnuheader = (const struct archive_entry_header_gnutar *)h;
			if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
				a->archive.archive_format_name = "GNU tar format";
				err2 = header_gnutar(a, tar, entry, h, unconsumed);
			} else if (memcmp(header->magic, "ustar", 5) == 0) {
				if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
					a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
					a->archive.archive_format_name = "POSIX ustar format";
				}
				err2 = header_ustar(a, tar, entry, h);
			} else {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR;
				a->archive.archive_format_name = "tar (non-POSIX)";
				err2 = header_old_tar(a, tar, entry, h);
			}
			err = err_combine(err, err2);
			/* We return warnings or success as-is.  Anything else is fatal. */
			if (err < ARCHIVE_WARN) {
				return (ARCHIVE_FATAL);
			}
			/* Filename of the form `._filename` is an AppleDouble
			 * extension entry.  The body is the macOS metadata blob;
			 * this is followed by another entry with the actual
			 * regular file data.
			 * This design has two drawbacks:
			 * = it's brittle; you might just have a file with such a name
			 * = it duplicates any long pathname extensions
			 *
			 * TODO: This probably shouldn't be here at all.  Consider
			 * just returning the contents as a regular entry here and
			 * then dealing with it when we write data to disk.
			 */
			if (tar->process_mac_extensions
			    && ((seen_headers & seen_mac_metadata) == 0)
			    && is_mac_metadata_entry(entry)) {
				err2 = read_mac_metadata_blob(a, entry, unconsumed);
				if (err2 < ARCHIVE_WARN) {
					return (ARCHIVE_FATAL);
				}
				err = err_combine(err, err2);
				/* Note: Other headers can appear again. */
				seen_headers = seen_mac_metadata;
				break;
			}

			/* Reconcile GNU sparse attributes */
			if (tar->sparse_gnu_attributes_seen) {
				/* Only 'S' (GNU sparse) and ustar '0' regular files can be sparse */
				if (tar->filetype != 'S' && tar->filetype != '0') {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "Non-regular file cannot be sparse");
					return (ARCHIVE_WARN);
				} else if (tar->sparse_gnu_major == 0 &&
				    tar->sparse_gnu_minor == 0) {
					/* Sparse map already parsed from 'x' header */
				} else if (tar->sparse_gnu_major == 0 &&
				    tar->sparse_gnu_minor == 1) {
					/* Sparse map already parsed from 'x' header */
				} else if (tar->sparse_gnu_major == 1 &&
				    tar->sparse_gnu_minor == 0) {
					/* Sparse map is prepended to file contents */
					ssize_t bytes_read;
					bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
					if (bytes_read < 0)
						return ((int)bytes_read);
					tar->entry_bytes_remaining -= bytes_read;
				} else {
					archive_set_error(&a->archive,
							  ARCHIVE_ERRNO_MISC,
							  "Unrecognized GNU sparse file format");
					return (ARCHIVE_WARN);
				}
			}
			return (err);
		}

		/* We're between headers ... */
		err = err_combine(err, err2);
		if (err == ARCHIVE_FATAL)
			return (err);

		/* The GNU volume header and the pax `g` global header
		 * are both allowed to be the only header in an
		 * archive.  If we've seen any other header, a
		 * following EOF is fatal. */
		if ((seen_headers & ~seen_V_header & ~seen_g_header) != 0) {
			eof_fatal = 1;
		}
	}
}